

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockFailureTest.cpp
# Opt level: O2

void __thiscall
TEST_MockFailureTest_MockUnexpectedOutputParameterFailure_Test::testBody
          (TEST_MockFailureTest_MockUnexpectedOutputParameterFailure_Test *this)

{
  MockCheckedExpectedCall *pMVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  UtestShell *pUVar3;
  char *pcVar4;
  TestTerminator *pTVar5;
  undefined1 local_e8 [16];
  int out2;
  int out1;
  MockNamedValue actualParameter;
  MockUnexpectedOutputParameterFailure failure;
  
  pMVar1 = (this->super_TEST_GROUP_CppUTestGroupMockFailureTest).call1;
  SimpleString::SimpleString((SimpleString *)&failure,"foo");
  iVar2 = (*(pMVar1->super_MockExpectedCall)._vptr_MockExpectedCall[2])
                    (pMVar1,(SimpleString *)&failure);
  SimpleString::SimpleString((SimpleString *)&actualParameter,"boo");
  (**(code **)(*(long *)CONCAT44(extraout_var,iVar2) + 0x30))
            ((long *)CONCAT44(extraout_var,iVar2),&actualParameter,&out1,4);
  SimpleString::~SimpleString((SimpleString *)&actualParameter);
  SimpleString::~SimpleString((SimpleString *)&failure);
  pMVar1 = (this->super_TEST_GROUP_CppUTestGroupMockFailureTest).call2;
  SimpleString::SimpleString((SimpleString *)&failure,"foo");
  iVar2 = (*(pMVar1->super_MockExpectedCall)._vptr_MockExpectedCall[2])
                    (pMVar1,(SimpleString *)&failure);
  SimpleString::SimpleString((SimpleString *)&actualParameter,"boo");
  (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar2) + 0x30))
            ((long *)CONCAT44(extraout_var_00,iVar2),&actualParameter,&out2,4);
  SimpleString::~SimpleString((SimpleString *)&actualParameter);
  SimpleString::~SimpleString((SimpleString *)&failure);
  pMVar1 = (this->super_TEST_GROUP_CppUTestGroupMockFailureTest).call3;
  SimpleString::SimpleString((SimpleString *)&failure,"unrelated");
  (*(pMVar1->super_MockExpectedCall)._vptr_MockExpectedCall[2])(pMVar1,(SimpleString *)&failure);
  SimpleString::~SimpleString((SimpleString *)&failure);
  TEST_GROUP_CppUTestGroupMockFailureTest::addThreeCallsToList
            (&this->super_TEST_GROUP_CppUTestGroupMockFailureTest);
  SimpleString::SimpleString((SimpleString *)&failure,"bar");
  MockNamedValue::MockNamedValue(&actualParameter,(SimpleString *)&failure);
  SimpleString::~SimpleString((SimpleString *)&failure);
  MockNamedValue::setValue(&actualParameter,(void *)0x123);
  pUVar3 = UtestShell::getCurrent();
  SimpleString::SimpleString((SimpleString *)local_e8,"foo");
  MockUnexpectedOutputParameterFailure::MockUnexpectedOutputParameterFailure
            (&failure,pUVar3,(SimpleString *)local_e8,&actualParameter,
             (this->super_TEST_GROUP_CppUTestGroupMockFailureTest).list);
  SimpleString::~SimpleString((SimpleString *)local_e8);
  pUVar3 = UtestShell::getCurrent();
  TestFailure::getMessage((TestFailure *)local_e8);
  pcVar4 = SimpleString::asCharString((SimpleString *)local_e8);
  pTVar5 = UtestShell::getCurrentTestTerminator();
  (*pUVar3->_vptr_UtestShell[9])
            (pUVar3,
             "Mock Failure: Unexpected output parameter name to function \"foo\": bar\n\tEXPECTED calls that WERE NOT fulfilled related to function: foo\n\t\tfoo -> const void* boo: <output> (expected 1 call, called 0 times)\n\t\tfoo -> const void* boo: <output> (expected 1 call, called 0 times)\n\tEXPECTED calls that WERE fulfilled related to function: foo\n\t\t<none>\n\tACTUAL unexpected output parameter passed to function: foo\n\t\tvoid* bar"
             ,pcVar4,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockFailureTest.cpp"
             ,0xc6,pTVar5);
  SimpleString::~SimpleString((SimpleString *)local_e8);
  TestFailure::~TestFailure((TestFailure *)&failure);
  MockNamedValue::~MockNamedValue(&actualParameter);
  return;
}

Assistant:

TEST(MockFailureTest, MockUnexpectedOutputParameterFailure)
{
    int out1;
    int out2;
    call1->withName("foo").withOutputParameterReturning("boo", &out1, sizeof(out1));
    call2->withName("foo").withOutputParameterReturning("boo", &out2, sizeof(out2));
    call3->withName("unrelated");
    addThreeCallsToList();

    MockNamedValue actualParameter("bar");
    actualParameter.setValue((void *)0x123);

    MockUnexpectedOutputParameterFailure failure(UtestShell::getCurrent(), "foo", actualParameter, *list);
    STRCMP_EQUAL("Mock Failure: Unexpected output parameter name to function \"foo\": bar\n"
                 "\tEXPECTED calls that WERE NOT fulfilled related to function: foo\n"
                 "\t\tfoo -> const void* boo: <output> (expected 1 call, called 0 times)\n"
                 "\t\tfoo -> const void* boo: <output> (expected 1 call, called 0 times)\n"
                 "\tEXPECTED calls that WERE fulfilled related to function: foo\n"
                 "\t\t<none>\n"
                 "\tACTUAL unexpected output parameter passed to function: foo\n"
                 "\t\tvoid* bar", failure.getMessage().asCharString());
}